

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.c
# Opt level: O2

void witness_print_witnesses(witness_list_t *witnesses)

{
  witness_t *pwVar1;
  witness_t *pwVar2;
  witness_t *pwVar3;
  witness_t *pwVar4;
  uint n;
  witness_t *w;
  
  pwVar3 = witnesses->qlh_first;
  n = 0;
  pwVar2 = pwVar3;
  w = (witness_t *)0x0;
  while (pwVar4 = pwVar2, pwVar4 != (witness_t *)0x0) {
    if ((w == (witness_t *)0x0) || (pwVar4->rank <= w->rank)) {
      n = n + 1;
    }
    else {
      witness_print_witness(w,n);
      pwVar3 = witnesses->qlh_first;
      n = 1;
    }
    pwVar1 = (pwVar4->link).qre_next;
    pwVar2 = (witness_t *)0x0;
    w = pwVar4;
    if (pwVar1 != pwVar3) {
      pwVar2 = pwVar1;
    }
  }
  if (w == (witness_t *)0x0) {
    return;
  }
  witness_print_witness(w,n);
  return;
}

Assistant:

static void
witness_print_witnesses(const witness_list_t *witnesses) {
	witness_t *w, *last = NULL;
	unsigned n = 0;
	ql_foreach(w, witnesses, link) {
		if (last != NULL && w->rank > last->rank) {
			assert(w->name != last->name);
			witness_print_witness(last, n);
			n = 0;
		} else if (last != NULL) {
			assert(w->rank == last->rank);
			assert(w->name == last->name);
		}
		last = w;
		++n;
	}
	if (last != NULL) {
		witness_print_witness(last, n);
	}
}